

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O1

int nn_xpull_add(nn_sockbase *self,nn_pipe *pipe)

{
  int extraout_EAX;
  nn_fq_data *pnVar1;
  nn_pipe *self_00;
  nn_pipe *pnVar2;
  int rcvprio;
  size_t sz;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  self_00 = (nn_pipe *)0x0;
  pnVar2 = pipe;
  nn_pipe_getopt(pipe,0,9,&local_24,&local_20);
  if (local_20 == 4) {
    if (0xffffffef < local_24 - 0x11U) {
      pnVar2 = (nn_pipe *)0x20;
      pnVar1 = (nn_fq_data *)nn_alloc_(0x20);
      if (pnVar1 != (nn_fq_data *)0x0) {
        nn_pipe_setdata(pipe,pnVar1);
        nn_fq_add((nn_fq *)(self + 1),pnVar1,pipe,local_24);
        return 0;
      }
      goto LAB_00124b33;
    }
  }
  else {
    nn_xpull_add_cold_1();
  }
  nn_xpull_add_cold_3();
LAB_00124b33:
  nn_xpull_add_cold_2();
  pnVar1 = (nn_fq_data *)nn_pipe_getdata(self_00);
  nn_fq_rm((nn_fq *)(pnVar2 + 0x10),pnVar1);
  nn_free(pnVar1);
  return extraout_EAX;
}

Assistant:

static int nn_xpull_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;
    int rcvprio;
    size_t sz;

    xpull = nn_cont (self, struct nn_xpull, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpull_data), "pipe data (pull)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_fq_add (&xpull->fq, &data->fq, pipe, rcvprio);

    return 0;
}